

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_objects_detector.cpp
# Opt level: O3

void __thiscall
feintrack::SimpleLeftObjectsDetector::AnalyzeShadyLeftObjects(SimpleLeftObjectsDetector *this)

{
  size_t *psVar1;
  int iVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  iterator __ret;
  
  p_Var3 = (this->shady_left_objects).
           super__List_base<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var4 = p_Var3, p_Var4 != (_List_node_base *)&this->shady_left_objects) {
    if (*(int *)((long)&p_Var4[2]._M_next + 4) == 0) {
      iVar2 = *(int *)&p_Var4[2]._M_prev;
      *(int *)&p_Var4[2]._M_prev = iVar2 + 1;
      p_Var3 = p_Var4->_M_next;
      if (this->left_object_time1 <= iVar2) {
        psVar1 = &(this->shady_left_objects).
                  super__List_base<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var4,0x30);
      }
    }
    else {
      p_Var3 = p_Var4->_M_next;
    }
  }
  return;
}

Assistant:

void SimpleLeftObjectsDetector::AnalyzeShadyLeftObjects()
{
    for (auto iter = shady_left_objects.begin(); iter != shady_left_objects.end();)
    {
        if (!iter->obj_uid)
        {
            iter->not_detect_time++;
            if (iter->not_detect_time > left_object_time1)
                iter = shady_left_objects.erase(iter);
            else
                ++iter;
        }
        else
        {
            ++iter;
        }
    }
}